

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O3

int IFN_Previous_Word(FORM *form)

{
  int iVar1;
  int iVar2;
  int iVar3;
  FIELD *pFVar4;
  char *pcVar5;
  char *pos;
  char *pcVar6;
  
  pFVar4 = form->current;
  iVar1 = pFVar4->dcols;
  iVar2 = form->currow;
  pcVar6 = pFVar4->buf;
  iVar3 = form->curcol;
  Synchronize_Buffer(form);
  pcVar5 = After_End_Of_Data(pFVar4->buf,
                             (int)(pcVar6 + (long)iVar3 + (long)iVar2 * (long)iVar1) -
                             (int)pFVar4->buf);
  pos = After_Last_Whitespace_Character(pFVar4->buf,(int)pcVar5 - (int)pFVar4->buf);
  if (pcVar5 == pcVar6 + (long)iVar3 + (long)iVar2 * (long)iVar1) {
    pcVar6 = After_End_Of_Data(pFVar4->buf,(int)pos - (int)pFVar4->buf);
    pos = After_Last_Whitespace_Character(pFVar4->buf,(int)pcVar6 - (int)pFVar4->buf);
  }
  Adjust_Cursor_Position(form,pos);
  return 0;
}

Assistant:

static int IFN_Previous_Word(FORM * form)
{
  FIELD *field = form->current;
  char  *bp    = Address_Of_Current_Position_In_Buffer(form);
  char  *s;
  char  *t;
  bool  again = FALSE;

  /* We really need access to the data, so we have to synchronize */
  Synchronize_Buffer(form);

  s = After_End_Of_Data(field->buf,(int)(bp-field->buf));
  /* s points now right after the last non-blank in the buffer before bp.
     If bp was in a word, s equals bp. In this case we must find the last
     whitespace in the buffer before bp and repeat the game to really find
     the previous word! */
  if (s==bp)
    again = TRUE;
  
  /* And next call now goes backward to look for the last whitespace
     before that, pointing right after this, so it points to the begin
     of the previous word. 
  */
  t = After_Last_Whitespace_Character(field->buf,(int)(s - field->buf));
#if !FRIENDLY_PREV_NEXT_WORD
  if (s==t) 
    return(E_REQUEST_DENIED);
#endif
  if (again)
    { /* and do it again, replacing bp by t */
      s = After_End_Of_Data(field->buf,(int)(t - field->buf));
      t = After_Last_Whitespace_Character(field->buf,(int)(s - field->buf));
#if !FRIENDLY_PREV_NEXT_WORD
      if (s==t) 
        return(E_REQUEST_DENIED);
#endif
    }
  Adjust_Cursor_Position(form,t);
  return(E_OK);
}